

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O0

int localConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_local_output *lo;
  void *ptr_local;
  mpt_type_t type_local;
  mpt_convertable *val_local;
  
  if (type == 0) {
    if (ptr != (void *)0x0) {
      *(uint8_t **)ptr = localConv::fmt;
    }
    val_local._4_4_ = 0x100;
  }
  else if (type == 0x100) {
    if (ptr != (void *)0x0) {
      *(_mpt_vptr_convertable **)ptr = val[5]._vptr;
    }
    val_local._4_4_ = 0x83;
  }
  else if (type == 0x84) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 1;
    }
    val_local._4_4_ = 0x83;
  }
  else if (type == 0x83) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 2;
    }
    val_local._4_4_ = 0x84;
  }
  else if (type == 0x81) {
    if (ptr != (void *)0x0) {
      *(mpt_convertable **)ptr = val + 3;
    }
    val_local._4_4_ = 0x84;
  }
  else if (type == 4) {
    if (ptr != (void *)0x0) {
      *(_mpt_vptr_convertable **)ptr = val[6]._vptr;
    }
    val_local._4_4_ = 0x83;
  }
  else {
    val_local._4_4_ = -3;
  }
  return val_local._4_4_;
}

Assistant:

static int localConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(local_output) *lo = (void *) val;
	
	if (!type) {
		static const uint8_t fmt[] = {
			MPT_ENUM(TypeObjectPtr),
			MPT_ENUM(TypeLoggerPtr),
			MPT_ENUM(TypeOutputPtr),
			MPT_ENUM(TypeFilePtr),
			0
		};
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
		}
		return MPT_ENUM(TypeMetaPtr);
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((void **) ptr) = lo->pass;
		return MPT_ENUM(TypeOutputPtr);
	}
	if (type == MPT_ENUM(TypeObjectPtr)) {
		if (ptr) *((void **) ptr) = &lo->_obj;
		return MPT_ENUM(TypeOutputPtr);
	}
	if (type == MPT_ENUM(TypeOutputPtr)) {
		if (ptr) *((void **) ptr) = &lo->_out;
		return MPT_ENUM(TypeObjectPtr);
	}
	if (type == MPT_ENUM(TypeLoggerPtr)) {
		if (ptr) *((void **) ptr) = &lo->_log;
		return MPT_ENUM(TypeObjectPtr);
	}
	if (type == MPT_ENUM(TypeFilePtr)) {
		if (ptr) *((void **) ptr) = lo->hist.info.file;
		return MPT_ENUM(TypeOutputPtr);
	}
	return MPT_ERROR(BadType);
}